

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

int __thiscall
TSMuxer::writeTSFrames
          (TSMuxer *this,int pid,uint8_t *buffer,int64_t len,bool priorityData,bool payloadStart)

{
  pointer puVar1;
  uint8_t *puVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  int iVar8;
  longlong pcr;
  ostream *poVar9;
  long lVar10;
  size_t __n;
  uint uVar11;
  size_t sVar12;
  uint local_44;
  uint8_t *local_40;
  mapped_type *local_38;
  
  local_44 = pid;
  local_38 = std::
             map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
             ::operator[](&this->m_streamInfo,(key_type_conflict *)&local_44);
  if (len < 1) {
    iVar8 = 0;
  }
  else {
    local_40 = buffer + len;
    uVar11 = (uint)payloadStart << 0xe;
    iVar8 = 0;
    do {
      puVar2 = local_40;
      if ((this->m_cbrBitrate != -1) && (this->m_lastPCR != -1)) {
        pcr = llround(((double)(this->m_lastPCR + (long)this->m_pcrBits) * 90000.0) /
                      (double)this->m_cbrBitrate);
        if ((this->m_lastPCR != -1) && ((long)this->m_pcr_delta <= pcr - this->m_lastPCR)) {
          this->m_pcrBits = 0;
          writePATPMT(this,pcr,false);
          writePCR(this,pcr);
          if ((this->m_lastPESDTS != -1) && (this->m_lastPESDTS < this->m_lastPCR)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"VBV buffer overflow at position ",0x20);
            poVar9 = std::ostream::_M_insert<double>
                               ((double)(this->m_lastPCR - this->m_fixed_pcr_offset) / 90000.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," sec",4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            sLastMsg = true;
          }
        }
      }
      if (this->m_m2tsMode == true) {
        this->m_outBufLen = this->m_outBufLen + 4;
        this->m_processedBlockSize = this->m_processedBlockSize + 4;
        this->m_pcrBits = this->m_pcrBits + 0x20;
      }
      sVar12 = (long)puVar2 - (long)buffer;
      puVar7 = this->m_outBuf;
      iVar4 = this->m_outBufLen;
      puVar2 = puVar7 + iVar4;
      puVar2[0] = 'G';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\x10';
      lVar10 = (long)this->m_outBufLen;
      __n = 0xb7 - (ulong)puVar7[lVar10 + 4];
      if ((*(uint *)(puVar7 + lVar10) >> 0x1d & 1) == 0) {
        __n = 0xb8;
      }
      *(uint *)(puVar7 + lVar10) =
           (local_44 & 0xff) << 0x10 | *(uint *)(puVar7 + lVar10) & 0xff00e0ff | local_44 & 0x1f00;
      uVar5 = local_38->m_tsCnt;
      local_38->m_tsCnt = uVar5 + 1;
      uVar6 = *(uint *)(puVar7 + lVar10);
      uVar11 = uVar11 | (uint)priorityData << 0xd | (uVar5 & 0xf) << 0x18 | uVar6 & 0xf0ff9fff;
      puVar3 = (uint *)(puVar7 + lVar10);
      *(uint *)(puVar7 + lVar10) = uVar11;
      if ((long)sVar12 < (long)__n) {
        if ((uVar6 >> 0x1d & 1) == 0) {
          *puVar3 = uVar11 | 0x20000000;
          if (__n - sVar12 == 1) {
            *(undefined1 *)(puVar3 + 1) = 0;
            __n = __n - 1;
          }
          else {
            puVar7 = puVar7 + (long)iVar4 + 4;
            puVar7[0] = '\x01';
            puVar7[1] = '\0';
            puVar7[2] = '\0';
            puVar7[3] = '\0';
            __n = __n - 2;
          }
        }
        lVar10 = (ulong)(byte)puVar3[1] + 5;
        if ((*puVar3 >> 0x1d & 1) == 0) {
          lVar10 = 4;
        }
        memset((void *)(lVar10 + (long)puVar3),0xff,__n - sVar12);
        *(char *)(puVar3 + 1) = (char)(__n - sVar12) + (char)(short)puVar3[1];
        __n = sVar12;
      }
      lVar10 = (ulong)(byte)puVar3[1] + 5;
      if ((*puVar3 >> 0x1d & 1) == 0) {
        lVar10 = 4;
      }
      memcpy(this->m_outBuf + lVar10 + this->m_outBufLen,buffer,__n);
      this->m_outBufLen = this->m_outBufLen + 0xbc;
      this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
      buffer = buffer + __n;
      this->m_pcrBits = this->m_pcrBits + 0x5e0;
      puVar1 = (this->m_muxedPacketCnt).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      *puVar1 = *puVar1 + 1;
      writeOutBuffer(this);
      iVar8 = iVar8 + 1;
      uVar11 = 0;
    } while (buffer < local_40);
  }
  return iVar8;
}

Assistant:

int TSMuxer::writeTSFrames(const int pid, const uint8_t* buffer, const int64_t len, const bool priorityData,
                           bool payloadStart)
{
    int result = 0;

    const uint8_t* curPos = buffer;
    const uint8_t* end = buffer + len;

    const bool tsPriority = priorityData;
    StreamInfo& streamInfo = m_streamInfo[pid];

    while (curPos < end)
    {
        if (m_cbrBitrate != -1 && m_lastPCR != -1)
        {
            const auto newPCR = llround(static_cast<double>(m_lastPCR + m_pcrBits) * 90000.0 / m_cbrBitrate);
            if (newPCR - m_lastPCR >= m_pcr_delta && m_lastPCR != -1)
            {
                m_pcrBits = 0;
                writePATPMT(newPCR);
                writePCR(newPCR);
                if (m_lastPESDTS != -1 && m_lastPCR > m_lastPESDTS)
                {
                    LTRACE(LT_ERROR, 2,
                           "VBV buffer overflow at position " << (double)(m_lastPCR - m_fixed_pcr_offset) / 90000.0
                                                              << " sec");
                }
            }
        }

        if (m_m2tsMode)
        {
            m_outBufLen += 4;
            m_processedBlockSize += 4;
            m_pcrBits += 4 * 8;
        }
        const int64_t tmpBufferLen = end - curPos;
        const auto initTS = reinterpret_cast<uint32_t*>(m_outBuf + m_outBufLen);
        *initTS = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
        const auto tsPacket = reinterpret_cast<TSPacket*>(m_outBuf + m_outBufLen);
        int64_t payloadLen = TS_FRAME_SIZE - tsPacket->getHeaderSize();
        tsPacket->setPID(pid);
        tsPacket->counter = streamInfo.m_tsCnt++;
        tsPacket->payloadStart = payloadStart;  // curPos == buffer;
        payloadStart = false;
        tsPacket->priority = tsPriority;
        if (tmpBufferLen < payloadLen)
        {
            // insert padding bytes
            if (!tsPacket->afExists)
            {
                tsPacket->afExists = 1;
                if (payloadLen - tmpBufferLen == 1)
                {
                    tsPacket->adaptiveField.length = 0;
                    payloadLen--;
                }
                else
                {
                    initTS[1] = 0x01;  // zero all af flags, set af len to 1.
                    payloadLen -= 2;
                }
            }
            memset(reinterpret_cast<uint8_t*>(tsPacket) + tsPacket->getHeaderSize(), 0xff, payloadLen - tmpBufferLen);
            tsPacket->adaptiveField.length += static_cast<unsigned>(payloadLen - tmpBufferLen);
            payloadLen = tmpBufferLen;
        }
        const int tsHeaderSize = tsPacket->getHeaderSize();
        memcpy(m_outBuf + m_outBufLen + tsHeaderSize, curPos, payloadLen);

        curPos += payloadLen;
        m_outBufLen += TS_FRAME_SIZE;
        m_processedBlockSize += TS_FRAME_SIZE;
        m_pcrBits += TS_FRAME_SIZE * 8;
        m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
        writeOutBuffer();
        result++;
    }
    return result;
}